

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::ShaderBuiltinConstantCase::getRefValue(ShaderBuiltinConstantCase *this)

{
  bool bVar1;
  int iVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  ulong uVar3;
  ContextInfo *this_00;
  
  iVar2 = std::__cxx11::string::compare((char *)&this->m_varName);
  this_00 = (this->super_ShaderRenderCase).m_ctxInfo;
  if (iVar2 == 0) {
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_draw_buffers");
    if (!bVar1) {
      return 1;
    }
    this_00 = (this->super_ShaderRenderCase).m_ctxInfo;
    UNRECOVERED_JUMPTABLE = this_00->_vptr_ContextInfo[2];
    uVar3 = 0x8824;
  }
  else {
    uVar3 = (ulong)this->m_paramName;
    UNRECOVERED_JUMPTABLE = this_00->_vptr_ContextInfo[2];
  }
  iVar2 = (*UNRECOVERED_JUMPTABLE)(this_00,uVar3);
  return iVar2;
}

Assistant:

int ShaderBuiltinConstantCase::getRefValue (void)
{
	if (m_varName == "gl_MaxDrawBuffers")
	{
		if (m_ctxInfo.isExtensionSupported("GL_EXT_draw_buffers"))
			return m_ctxInfo.getInt(GL_MAX_DRAW_BUFFERS);
		else
			return 1;
	}
	else
	{
		DE_ASSERT(m_paramName != GL_NONE);
		return m_ctxInfo.getInt(m_paramName);
	}
}